

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O0

void soplex::
     MPSreadCols<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (MPSInput *mps,
               LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *rset,NameSet *rnames,
               LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *cset,NameSet *cnames,DIdxSet *intvars)

{
  undefined1 uVar1;
  bool bVar2;
  type_conflict5 tVar3;
  int iVar4;
  char *pcVar5;
  ostream *this;
  char *__s2;
  NameSet *in_RDX;
  MPSInput *in_RDI;
  long in_R9;
  int ncnames;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  vec;
  LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  col;
  char colname [256];
  int idx;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  undefined4 in_stack_fffffffffffffab8;
  int in_stack_fffffffffffffabc;
  MPSInput *in_stack_fffffffffffffac0;
  NameSet *in_stack_fffffffffffffac8;
  NameSet *in_stack_fffffffffffffad0;
  undefined4 in_stack_fffffffffffffad8;
  int in_stack_fffffffffffffadc;
  MPSInput *in_stack_fffffffffffffae0;
  undefined7 in_stack_fffffffffffffb40;
  cpp_dec_float<50U,_int,_void> *this_00;
  MPSInput *in_stack_fffffffffffffb58;
  double local_498 [3];
  undefined8 local_480;
  undefined1 local_478 [8];
  undefined1 local_440 [56];
  undefined8 local_408;
  undefined1 local_400 [56];
  undefined8 local_3c8;
  undefined1 local_3c0 [56];
  int local_388;
  undefined4 local_384;
  undefined8 local_380;
  undefined1 local_374 [300];
  char local_248 [248];
  ulong uStack_150;
  int local_144;
  undefined1 local_140 [56];
  long local_108;
  NameSet *local_f0;
  MPSInput *local_e0;
  undefined8 local_d8;
  undefined8 *local_d0;
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined8 *local_b8;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined8 *local_a0;
  undefined1 *local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined1 *local_80;
  undefined8 local_78;
  undefined8 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined8 *local_58;
  undefined8 local_50;
  undefined8 *local_48;
  undefined8 *local_40;
  undefined8 *local_38;
  double *local_30;
  undefined1 *local_28;
  double *local_20;
  double *local_18;
  undefined1 *local_10;
  double *local_8;
  
  local_60 = local_140;
  local_108 = in_R9;
  local_f0 = in_RDX;
  local_e0 = in_RDI;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffac0);
  this_00 = (cpp_dec_float<50U,_int,_void> *)0x0;
  local_248[0xf0] = '\0';
  local_248[0xf1] = '\0';
  local_248[0xf2] = '\0';
  local_248[0xf3] = '\0';
  local_248[0xf4] = '\0';
  local_248[0xf5] = '\0';
  local_248[0xf6] = '\0';
  local_248[0xf7] = '\0';
  uStack_150 = 0;
  local_248[0xe0] = '\0';
  local_248[0xe1] = '\0';
  local_248[0xe2] = '\0';
  local_248[0xe3] = '\0';
  local_248[0xe4] = '\0';
  local_248[0xe5] = '\0';
  local_248[0xe6] = '\0';
  local_248[0xe7] = '\0';
  local_248[0xe8] = '\0';
  local_248[0xe9] = '\0';
  local_248[0xea] = '\0';
  local_248[0xeb] = '\0';
  local_248[0xec] = '\0';
  local_248[0xed] = '\0';
  local_248[0xee] = '\0';
  local_248[0xef] = '\0';
  local_248[0xd0] = '\0';
  local_248[0xd1] = '\0';
  local_248[0xd2] = '\0';
  local_248[0xd3] = '\0';
  local_248[0xd4] = '\0';
  local_248[0xd5] = '\0';
  local_248[0xd6] = '\0';
  local_248[0xd7] = '\0';
  local_248[0xd8] = '\0';
  local_248[0xd9] = '\0';
  local_248[0xda] = '\0';
  local_248[0xdb] = '\0';
  local_248[0xdc] = '\0';
  local_248[0xdd] = '\0';
  local_248[0xde] = '\0';
  local_248[0xdf] = '\0';
  local_248[0xc0] = '\0';
  local_248[0xc1] = '\0';
  local_248[0xc2] = '\0';
  local_248[0xc3] = '\0';
  local_248[0xc4] = '\0';
  local_248[0xc5] = '\0';
  local_248[0xc6] = '\0';
  local_248[199] = '\0';
  local_248[200] = '\0';
  local_248[0xc9] = '\0';
  local_248[0xca] = '\0';
  local_248[0xcb] = '\0';
  local_248[0xcc] = '\0';
  local_248[0xcd] = '\0';
  local_248[0xce] = '\0';
  local_248[0xcf] = '\0';
  local_248[0xb0] = '\0';
  local_248[0xb1] = '\0';
  local_248[0xb2] = '\0';
  local_248[0xb3] = '\0';
  local_248[0xb4] = '\0';
  local_248[0xb5] = '\0';
  local_248[0xb6] = '\0';
  local_248[0xb7] = '\0';
  local_248[0xb8] = '\0';
  local_248[0xb9] = '\0';
  local_248[0xba] = '\0';
  local_248[0xbb] = '\0';
  local_248[0xbc] = '\0';
  local_248[0xbd] = '\0';
  local_248[0xbe] = '\0';
  local_248[0xbf] = '\0';
  local_248[0xa0] = '\0';
  local_248[0xa1] = '\0';
  local_248[0xa2] = '\0';
  local_248[0xa3] = '\0';
  local_248[0xa4] = '\0';
  local_248[0xa5] = '\0';
  local_248[0xa6] = '\0';
  local_248[0xa7] = '\0';
  local_248[0xa8] = '\0';
  local_248[0xa9] = '\0';
  local_248[0xaa] = '\0';
  local_248[0xab] = '\0';
  local_248[0xac] = '\0';
  local_248[0xad] = '\0';
  local_248[0xae] = '\0';
  local_248[0xaf] = '\0';
  local_248[0x90] = '\0';
  local_248[0x91] = '\0';
  local_248[0x92] = '\0';
  local_248[0x93] = '\0';
  local_248[0x94] = '\0';
  local_248[0x95] = '\0';
  local_248[0x96] = '\0';
  local_248[0x97] = '\0';
  local_248[0x98] = '\0';
  local_248[0x99] = '\0';
  local_248[0x9a] = '\0';
  local_248[0x9b] = '\0';
  local_248[0x9c] = '\0';
  local_248[0x9d] = '\0';
  local_248[0x9e] = '\0';
  local_248[0x9f] = '\0';
  local_248[0x80] = '\0';
  local_248[0x81] = '\0';
  local_248[0x82] = '\0';
  local_248[0x83] = '\0';
  local_248[0x84] = '\0';
  local_248[0x85] = '\0';
  local_248[0x86] = '\0';
  local_248[0x87] = '\0';
  local_248[0x88] = '\0';
  local_248[0x89] = '\0';
  local_248[0x8a] = '\0';
  local_248[0x8b] = '\0';
  local_248[0x8c] = '\0';
  local_248[0x8d] = '\0';
  local_248[0x8e] = '\0';
  local_248[0x8f] = '\0';
  local_248[0x70] = '\0';
  local_248[0x71] = '\0';
  local_248[0x72] = '\0';
  local_248[0x73] = '\0';
  local_248[0x74] = '\0';
  local_248[0x75] = '\0';
  local_248[0x76] = '\0';
  local_248[0x77] = '\0';
  local_248[0x78] = '\0';
  local_248[0x79] = '\0';
  local_248[0x7a] = '\0';
  local_248[0x7b] = '\0';
  local_248[0x7c] = '\0';
  local_248[0x7d] = '\0';
  local_248[0x7e] = '\0';
  local_248[0x7f] = '\0';
  local_248[0x60] = '\0';
  local_248[0x61] = '\0';
  local_248[0x62] = '\0';
  local_248[99] = '\0';
  local_248[100] = '\0';
  local_248[0x65] = '\0';
  local_248[0x66] = '\0';
  local_248[0x67] = '\0';
  local_248[0x68] = '\0';
  local_248[0x69] = '\0';
  local_248[0x6a] = '\0';
  local_248[0x6b] = '\0';
  local_248[0x6c] = '\0';
  local_248[0x6d] = '\0';
  local_248[0x6e] = '\0';
  local_248[0x6f] = '\0';
  local_248[0x50] = '\0';
  local_248[0x51] = '\0';
  local_248[0x52] = '\0';
  local_248[0x53] = '\0';
  local_248[0x54] = '\0';
  local_248[0x55] = '\0';
  local_248[0x56] = '\0';
  local_248[0x57] = '\0';
  local_248[0x58] = '\0';
  local_248[0x59] = '\0';
  local_248[0x5a] = '\0';
  local_248[0x5b] = '\0';
  local_248[0x5c] = '\0';
  local_248[0x5d] = '\0';
  local_248[0x5e] = '\0';
  local_248[0x5f] = '\0';
  local_248[0x40] = '\0';
  local_248[0x41] = '\0';
  local_248[0x42] = '\0';
  local_248[0x43] = '\0';
  local_248[0x44] = '\0';
  local_248[0x45] = '\0';
  local_248[0x46] = '\0';
  local_248[0x47] = '\0';
  local_248[0x48] = '\0';
  local_248[0x49] = '\0';
  local_248[0x4a] = '\0';
  local_248[0x4b] = '\0';
  local_248[0x4c] = '\0';
  local_248[0x4d] = '\0';
  local_248[0x4e] = '\0';
  local_248[0x4f] = '\0';
  local_248[0x30] = '\0';
  local_248[0x31] = '\0';
  local_248[0x32] = '\0';
  local_248[0x33] = '\0';
  local_248[0x34] = '\0';
  local_248[0x35] = '\0';
  local_248[0x36] = '\0';
  local_248[0x37] = '\0';
  local_248[0x38] = '\0';
  local_248[0x39] = '\0';
  local_248[0x3a] = '\0';
  local_248[0x3b] = '\0';
  local_248[0x3c] = '\0';
  local_248[0x3d] = '\0';
  local_248[0x3e] = '\0';
  local_248[0x3f] = '\0';
  local_248[0x20] = '\0';
  local_248[0x21] = '\0';
  local_248[0x22] = '\0';
  local_248[0x23] = '\0';
  local_248[0x24] = '\0';
  local_248[0x25] = '\0';
  local_248[0x26] = '\0';
  local_248[0x27] = '\0';
  local_248[0x28] = '\0';
  local_248[0x29] = '\0';
  local_248[0x2a] = '\0';
  local_248[0x2b] = '\0';
  local_248[0x2c] = '\0';
  local_248[0x2d] = '\0';
  local_248[0x2e] = '\0';
  local_248[0x2f] = '\0';
  local_248[0x10] = '\0';
  local_248[0x11] = '\0';
  local_248[0x12] = '\0';
  local_248[0x13] = '\0';
  local_248[0x14] = '\0';
  local_248[0x15] = '\0';
  local_248[0x16] = '\0';
  local_248[0x17] = '\0';
  local_248[0x18] = '\0';
  local_248[0x19] = '\0';
  local_248[0x1a] = '\0';
  local_248[0x1b] = '\0';
  local_248[0x1c] = '\0';
  local_248[0x1d] = '\0';
  local_248[0x1e] = '\0';
  local_248[0x1f] = '\0';
  local_248[0] = '\0';
  local_248[1] = '\0';
  local_248[2] = '\0';
  local_248[3] = '\0';
  local_248[4] = '\0';
  local_248[5] = '\0';
  local_248[6] = '\0';
  local_248[7] = '\0';
  local_248[8] = '\0';
  local_248[9] = '\0';
  local_248[10] = '\0';
  local_248[0xb] = '\0';
  local_248[0xc] = '\0';
  local_248[0xd] = '\0';
  local_248[0xe] = '\0';
  local_248[0xf] = '\0';
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::num((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)0x14143c);
  LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::LPColBase((LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)in_stack_fffffffffffffad0,(int)((ulong)in_stack_fffffffffffffac8 >> 0x20));
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::DSVectorBase((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffffad0,(int)((ulong)in_stack_fffffffffffffac8 >> 0x20));
  local_380 = 0;
  local_c8 = local_374;
  local_d0 = &local_380;
  local_d8 = 0;
  local_38 = local_d0;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffad0,
             (double)in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
  LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setObj((LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)in_stack_fffffffffffffac0,
           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x1414f0);
  do {
    uVar1 = MPSInput::readLine(in_stack_fffffffffffffb58);
    if (!(bool)uVar1) {
LAB_00141cef:
      MPSInput::syntaxError(in_stack_fffffffffffffac0);
      local_384 = 0;
LAB_00141d09:
      DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::~DSVectorBase((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)in_stack_fffffffffffffac0);
      LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::~LPColBase((LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)0x141d23);
      return;
    }
    pcVar5 = MPSInput::field0(local_e0);
    if (pcVar5 != (char *)0x0) {
      pcVar5 = MPSInput::field0(local_e0);
      iVar4 = strcmp(pcVar5,"RHS");
      if (iVar4 == 0) {
        if (local_248[0] != '\0') {
          LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::setColVector((LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)in_stack_fffffffffffffac0,
                         (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
          LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)in_stack_fffffffffffffad0,
                (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)in_stack_fffffffffffffac8);
        }
        MPSInput::setSection(local_e0,RHS);
        local_384 = 1;
        goto LAB_00141d09;
      }
      goto LAB_00141cef;
    }
    pcVar5 = MPSInput::field1(local_e0);
    if (((pcVar5 == (char *)0x0) || (pcVar5 = MPSInput::field2(local_e0), pcVar5 == (char *)0x0)) ||
       (pcVar5 = MPSInput::field3(local_e0), pcVar5 == (char *)0x0)) goto LAB_00141cef;
    pcVar5 = MPSInput::field1(local_e0);
    iVar4 = strcmp(local_248,pcVar5);
    if (iVar4 != 0) {
      if (local_248[0] != '\0') {
        LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::setColVector((LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)in_stack_fffffffffffffac0,
                       (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
        LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)in_stack_fffffffffffffad0,
              (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)in_stack_fffffffffffffac8);
      }
      pcVar5 = MPSInput::field1(local_e0);
      spxSnprintf(local_248,0xff,"%s",pcVar5);
      uStack_150 = uStack_150 & 0xffffffffffffff;
      local_388 = NameSet::size((NameSet *)0x1416e7);
      NameSet::add(in_stack_fffffffffffffad0,(char *)in_stack_fffffffffffffac8);
      iVar4 = NameSet::size((NameSet *)0x14170f);
      if (iVar4 <= local_388) {
        this = std::operator<<((ostream *)&std::cerr,
                               "ERROR in COLUMNS: duplicate column name or not column-wise ordering"
                              );
        std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
        goto LAB_00141cef;
      }
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::clear((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x141757);
      local_3c8 = 0;
      local_b0 = local_3c0;
      local_b8 = &local_3c8;
      local_c0 = 0;
      local_40 = local_b8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffad0,
                 (double)in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
      LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::setObj((LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_fffffffffffffac0,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
      local_408 = 0;
      local_98 = local_400;
      local_a0 = &local_408;
      local_a8 = 0;
      local_48 = local_a0;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffad0,
                 (double)in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
      LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::setLower((LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffffac0,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
      local_88 = infinity();
      local_80 = local_440;
      local_90 = 0;
      local_50 = local_88;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffad0,
                 (double)in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
      LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::setUpper((LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffffac0,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
      bVar2 = MPSInput::isInteger(local_e0);
      if (bVar2) {
        if (local_108 != 0) {
          NameSet::number(in_stack_fffffffffffffac8,(char *)in_stack_fffffffffffffac0);
          DIdxSet::addIdx((DIdxSet *)in_stack_fffffffffffffac0,in_stack_fffffffffffffabc);
        }
        local_480 = 0x3ff0000000000000;
        local_68 = local_478;
        local_70 = &local_480;
        local_78 = 0;
        local_58 = local_70;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffad0,
                   (double)in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
        LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::setUpper((LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)in_stack_fffffffffffffac0,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
      }
    }
    pcVar5 = MPSInput::field3(local_e0);
    local_498[2] = atof(pcVar5);
    local_10 = local_140;
    local_18 = local_498 + 2;
    local_8 = local_18;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              (this_00,(double)CONCAT17(uVar1,in_stack_fffffffffffffb40));
    pcVar5 = MPSInput::field2(local_e0);
    __s2 = MPSInput::objName(local_e0);
    iVar4 = strcmp(pcVar5,__s2);
    if (iVar4 == 0) {
      LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::setObj((LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_fffffffffffffac0,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
    }
    else {
      MPSInput::field2(local_e0);
      local_144 = NameSet::number(in_stack_fffffffffffffac8,(char *)in_stack_fffffffffffffac0);
      if (local_144 < 0) {
        MPSInput::field1(local_e0);
        MPSInput::field2(local_e0);
        MPSInput::entryIgnored
                  (in_stack_fffffffffffffae0,
                   (char *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                   (char *)in_stack_fffffffffffffad0,(char *)in_stack_fffffffffffffac8,
                   (char *)in_stack_fffffffffffffac0);
      }
      else {
        local_498[1] = 0.0;
        tVar3 = boost::multiprecision::operator!=
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                           (double *)0x141b0b);
        if (tVar3) {
          DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::add((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)in_stack_fffffffffffffad0,(int)((ulong)in_stack_fffffffffffffac8 >> 0x20),
                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)in_stack_fffffffffffffac0);
        }
      }
    }
    pcVar5 = MPSInput::field5(local_e0);
    if (pcVar5 != (char *)0x0) {
      pcVar5 = MPSInput::field5(local_e0);
      local_498[0] = atof(pcVar5);
      local_28 = local_140;
      local_30 = local_498;
      local_20 = local_30;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                (this_00,(double)CONCAT17(uVar1,in_stack_fffffffffffffb40));
      in_stack_fffffffffffffae0 = (MPSInput *)MPSInput::field4(local_e0);
      pcVar5 = MPSInput::objName(local_e0);
      iVar4 = strcmp((char *)in_stack_fffffffffffffae0,pcVar5);
      if (iVar4 == 0) {
        LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::setObj((LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffffac0,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
      }
      else {
        in_stack_fffffffffffffad0 = local_f0;
        MPSInput::field4(local_e0);
        in_stack_fffffffffffffadc =
             NameSet::number(in_stack_fffffffffffffac8,(char *)in_stack_fffffffffffffac0);
        local_144 = in_stack_fffffffffffffadc;
        if (in_stack_fffffffffffffadc < 0) {
          in_stack_fffffffffffffac0 = local_e0;
          in_stack_fffffffffffffac8 = (NameSet *)MPSInput::field1(local_e0);
          MPSInput::field4(local_e0);
          MPSInput::entryIgnored
                    (in_stack_fffffffffffffae0,
                     (char *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                     (char *)in_stack_fffffffffffffad0,(char *)in_stack_fffffffffffffac8,
                     (char *)in_stack_fffffffffffffac0);
        }
        else {
          tVar3 = boost::multiprecision::operator!=
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                             (double *)0x141cb4);
          in_stack_fffffffffffffabc = CONCAT13(tVar3,(int3)in_stack_fffffffffffffabc);
          if (tVar3) {
            DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::add((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)in_stack_fffffffffffffad0,(int)((ulong)in_stack_fffffffffffffac8 >> 0x20),
                  (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)in_stack_fffffffffffffac0);
          }
        }
      }
    }
  } while( true );
}

Assistant:

static void MPSreadCols(MPSInput& mps, const LPRowSetBase<R>& rset, const NameSet&  rnames,
                        LPColSetBase<R>& cset, NameSet& cnames, DIdxSet* intvars)
{
   R val;
   int idx;
   char colname[MPSInput::MAX_LINE_LEN] = { '\0' };
   LPColBase<R> col(rset.num());
   DSVectorBase<R> vec;

   col.setObj(0.0);
   vec.clear();

   while(mps.readLine())
   {
      if(mps.field0() != nullptr)
      {
         if(strcmp(mps.field0(), "RHS"))
            break;

         if(colname[0] != '\0')
         {
            col.setColVector(vec);
            cset.add(col);
         }

         mps.setSection(MPSInput::RHS);

         return;
      }

      if((mps.field1() == nullptr) || (mps.field2() == nullptr) || (mps.field3() == nullptr))
         break;

      // new column?
      if(strcmp(colname, mps.field1()))
      {
         // first column?
         if(colname[0] != '\0')
         {
            col.setColVector(vec);
            cset.add(col);
         }

         // save copy of string (make sure string ends with \0)
         spxSnprintf(colname, MPSInput::MAX_LINE_LEN - 1, "%s", mps.field1());
         colname[MPSInput::MAX_LINE_LEN - 1] = '\0';

         int ncnames = cnames.size();
         cnames.add(colname);

         // check whether the new name is unique wrt previous column names
         if(cnames.size() <= ncnames)
         {
            SPX_MSG_ERROR(std::cerr << "ERROR in COLUMNS: duplicate column name or not column-wise ordering" <<
                          std::endl;)
            break;
         }

         vec.clear();
         col.setObj(0.0);
         col.setLower(0.0);
         col.setUpper(R(infinity));

         if(mps.isInteger())
         {
            assert(cnames.number(colname) == cset.num());

            if(intvars != nullptr)
               intvars->addIdx(cnames.number(colname));

            // for Integer variable the default bounds are 0/1
            col.setUpper(1.0);
         }
      }

      val = atof(mps.field3());

      if(!strcmp(mps.field2(), mps.objName()))
         col.setObj(val);
      else
      {
         if((idx = rnames.number(mps.field2())) < 0)
            mps.entryIgnored("Column", mps.field1(), "row", mps.field2());
         else if(val != 0.0)
            vec.add(idx, val);
      }

      if(mps.field5() != nullptr)
      {
         assert(mps.field4() != nullptr);

         val = atof(mps.field5());

         if(!strcmp(mps.field4(), mps.objName()))
            col.setObj(val);
         else
         {
            if((idx = rnames.number(mps.field4())) < 0)
               mps.entryIgnored("Column", mps.field1(), "row", mps.field4());
            else if(val != 0.0)
               vec.add(idx, val);
         }
      }
   }

   mps.syntaxError();
}